

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::qualBoundViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  VectorBase<double> solu;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            ((VectorBase<double> *)&local_38,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this,&local_38);
  uVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = 0;
  uVar6 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar6 = uVar7;
  }
  do {
    if (uVar6 == uVar7) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
      return;
    }
    dVar1 = local_38._M_impl.super__Vector_impl_data._M_start[uVar7];
    dVar2 = pdVar4[uVar7];
    if (dVar2 <= dVar1) {
      dVar2 = pdVar5[uVar7];
      dVar8 = 0.0;
      if (dVar2 < dVar1) goto LAB_0018d50c;
    }
    else {
LAB_0018d50c:
      dVar8 = ABS(dVar1 - dVar2);
    }
    if (*maxviol <= dVar8 && dVar8 != *maxviol) {
      *maxviol = dVar8;
    }
    *sumviol = dVar8 + *sumviol;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::qualBoundViolation(
   R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int col = 0; col < this->nCols(); ++col)
   {
      assert(this->lower(col) <= this->upper(col) + 1e-9);

      R viol = 0.0;

      if(solu[col] < this->lower(col))
         viol = spxAbs(solu[col] - this->lower(col));
      else if(solu[col] > this->upper(col))
         viol = spxAbs(solu[col] - this->upper(col));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}